

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::dht_put_alert::dht_put_alert
          (dht_put_alert *this,stack_allocator *param_1,sha1_hash *t,int n)

{
  int n_local;
  sha1_hash *t_local;
  stack_allocator *param_1_local;
  dht_put_alert *this_local;
  
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_put_alert_00b89ba8;
  *(undefined8 *)(this->target).m_number._M_elems = *(undefined8 *)(t->m_number)._M_elems;
  *(undefined8 *)((this->target).m_number._M_elems + 2) =
       *(undefined8 *)((t->m_number)._M_elems + 2);
  (this->target).m_number._M_elems[4] = (t->m_number)._M_elems[4];
  memset(&this->public_key,0,0x20);
  memset(&this->signature,0,0x40);
  ::std::__cxx11::string::string((string *)&this->salt);
  this->seq = 0;
  this->num_success = n;
  return;
}

Assistant:

dht_put_alert::dht_put_alert(aux::stack_allocator&, sha1_hash const& t, int n)
		: target(t)
		, public_key()
		, signature()
		, seq(0)
		, num_success(n)
	{}